

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_type_safe::noflag_t_&,_const_type_safe::flag_set<test_flags>_&> * __thiscall
Catch::ExprLhs<type_safe::noflag_t_const&>::operator==
          (BinaryExpr<const_type_safe::noflag_t_&,_const_type_safe::flag_set<test_flags>_&>
           *__return_storage_ptr__,ExprLhs<type_safe::noflag_t_const&> *this,
          flag_set<test_flags> *rhs)

{
  int_type iVar1;
  noflag_t *pnVar2;
  StringRef local_38;
  
  iVar1 = (rhs->flags_).bits_;
  pnVar2 = *(noflag_t **)this;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = iVar1 == '\0';
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021dad0;
  __return_storage_ptr__->m_lhs = pnVar2;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }